

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::LinkCtorCacheToGuardedProperties(Lowerer *this,JITTimeConstructorCache *ctorCache)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  JITTimeConstructorCache *this_00;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  FunctionJITTimeInfo *pFVar9;
  undefined4 *puVar10;
  ObjTypeSpecFldInfo *this_01;
  JITTimeFunctionBody *this_02;
  char16 *pcVar11;
  char16 *pcVar12;
  intptr_t iVar13;
  JITType *this_03;
  intptr_t iVar14;
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  BVUnitT<unsigned_long> local_48;
  JITTimeConstructorCache *local_40;
  uint local_34;
  
  local_40 = ctorCache;
  pBVar8 = JITTimeConstructorCache::GetGuardedPropOps(ctorCache);
  if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    return false;
  }
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar4 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
  if (!bVar4) {
    return false;
  }
  pBVar8 = JITTimeConstructorCache::GetGuardedPropOps(local_40);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar4 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1fd8,
                       "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())",
                       "this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()");
    if (!bVar4) goto LAB_0056630f;
    *puVar10 = 0;
  }
  if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
    if (!bVar4) {
LAB_0056630f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  else {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  bVar4 = false;
  do {
    pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head;
    if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return bVar4;
    }
    TVar1 = *(Type *)&pBVar8->lastFoundIndex;
    local_48.word = ((Type *)&pBVar8->alloc)->word;
    while (local_48.word != 0) {
      lVar2 = 0;
      if (local_48.word != 0) {
        for (; (local_48.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear(&local_48,(BVIndex)lVar2);
      this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,TVar1 + (BVIndex)lVar2);
      local_34 = ObjTypeSpecFldInfo::GetPropertyId(this_01);
      bVar5 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
      if (((bVar5) || (bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar5)) ||
         (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar5)) {
        bVar5 = ObjTypeSpecFldInfo::IsPoly(this_01);
        if (((bVar5) && (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar5)) &&
           ((bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar5 &&
            (bVar5 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar5)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1fee,
                             "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                             ,
                             "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                            );
          if (!bVar5) goto LAB_0056630f;
          *puVar10 = 0;
        }
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar9,local_34);
        if (bVar5) {
          uVar6 = Func::GetSourceContextId(this->m_func);
          uVar7 = Func::GetLocalFunctionId(this->m_func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar6,uVar7);
          if (bVar4) {
LAB_00566204:
            this_02 = Func::GetJITFunctionBody(this->m_func);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(this_02);
            pcVar12 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_c8);
            this_00 = local_40;
            iVar13 = JITTimeConstructorCache::GetRuntimeCacheAddr(local_40);
            register0x00000000 = JITTimeConstructorCache::GetType(this_00);
            this_03 = JITTypeHolderBase<void>::operator->
                                ((JITTypeHolderBase<void> *)(debugStringBuffer + 0x28));
            iVar14 = JITType::GetAddr(this_03);
            Output::Print(L"ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"
                          ,pcVar11,pcVar12,iVar13,iVar14,(ulong)local_34);
            Output::Flush();
          }
          else {
            uVar6 = Func::GetSourceContextId(this->m_func);
            uVar7 = Func::GetLocalFunctionId(this->m_func);
            bVar4 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_01453738,TracePropertyGuardsPhase,uVar6,uVar7);
            if (bVar4) goto LAB_00566204;
          }
          Func::EnsureCtorCachesByPropertyId(this->m_func);
          Func::LinkCtorCacheToPropertyId(this->m_func,local_34,local_40);
          bVar4 = true;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1ff7,"(false)",
                             "Did we fail to create a shared property guard for a guarded property?"
                            );
          if (!bVar5) goto LAB_0056630f;
          *puVar10 = 0;
        }
      }
    }
  } while( true );
}

Assistant:

bool
Lowerer::LinkCtorCacheToGuardedProperties(JITTimeConstructorCache* ctorCache)
{
    // We do not always have guarded properties. If the constructor is empty and the subsequent code doesn't load or store any of
    // the constructed object's properties, or if all inline caches are empty then this ctor cache doesn't guard any properties.
    if (ctorCache->GetGuardedPropOps() == nullptr)
    {
        return false;
    }

    bool linked = false;

    if (this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        linked = LinkGuardToGuardedProperties(ctorCache->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    ctorCache->GetRuntimeCacheAddr(), ctorCache->GetType()->GetAddr(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsureCtorCachesByPropertyId();
            this->m_func->LinkCtorCacheToPropertyId(propertyId, ctorCache);
        });
    }
    return linked;
}